

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool __thiscall
picojson::input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::match
          (input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this,string *pattern)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  FILE *__stream;
  int __c;
  FILE *__stream_00;
  undefined8 local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  const_iterator pi;
  string *pattern_local;
  input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this_local;
  
  pi._M_current = (char *)pattern;
  local_28._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_30 = std::__cxx11::string::end();
    __stream_00 = (FILE *)&stack0xffffffffffffffd0;
    bVar1 = __gnu_cxx::operator!=
                      (&stack0xffffffffffffffd8,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)__stream_00);
    if (!bVar1) {
      return true;
    }
    iVar2 = getc(this,__stream_00);
    __c = (int)__stream_00;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&stack0xffffffffffffffd8);
    if (iVar2 != *pcVar3) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&stack0xffffffffffffffd8);
  }
  ungetc(this,__c,__stream);
  return false;
}

Assistant:

bool match(const std::string& pattern) {
      for (std::string::const_iterator pi(pattern.begin());
       pi != pattern.end();
       ++pi) {
    if (getc() != *pi) {
      ungetc();
      return false;
    }
      }
      return true;
    }